

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_benchmark.cpp
# Opt level: O2

void print_stats(double result,double elapsed)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"|   * result: ");
  poVar1 = std::ostream::_M_insert<double>(result);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"|   * time: ");
  poVar1 = std::ostream::_M_insert<double>(elapsed);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"|");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

inline void print_stats(double result, double elapsed)
{
  std::cout << "|" << std::endl;
  std::cout << "|   * result: " << result << std::endl;
  std::cout << "|   * time: " << elapsed << std::endl;
  std::cout << "|" << std::endl;
  std::cout << std::endl;
}